

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandCexMin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *p;
  Gia_Man_t *pAig;
  Abc_Cex_t *p_00;
  char *pcVar6;
  uint local_40;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  uVar3 = 1000;
  local_40 = 1;
LAB_00233973:
  while (iVar2 = Extra_UtilGetopt(argc,argv,"CRvh"), iVar5 = globalUtilOptind, iVar2 == 0x43) {
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00233af0:
      iVar5 = -1;
      goto LAB_00233af5;
    }
    uVar3 = atoi(argv[globalUtilOptind]);
    uVar4 = uVar3;
joined_r0x002339dc:
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar4 < 0) {
LAB_00233afc:
      Abc_Print(-2,"usage: cexmin [-CR num] [-vh]\n");
      Abc_Print(-2,"\t         reduces the length of the counter-example\n");
      Abc_Print(-2,"\t-C num : the maximum number of conflicts [default = %d]\n",(ulong)uVar3);
      Abc_Print(-2,"\t-R num : the number of minimization rounds [default = %d]\n",(ulong)local_40);
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing optimization summary [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  if (iVar2 < 0x68) {
    if (iVar2 == -1) {
      if (pAbc->pCex == (Abc_Cex_t *)0x0) {
        pcVar6 = "There is no current cex.\n";
      }
      else {
        pNtk = Abc_FrameReadNtk(pAbc);
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar6 = "Main AIG: There is no current network.\n";
        }
        else {
          if (pNtk->ntkType == ABC_NTK_STRASH) {
            if (pNtk->vPis->nSize != pAbc->pCex->nPis) {
              Abc_Print(1,"Main AIG: The number of PIs (%d) is different from cex (%d).\n");
              return 0;
            }
            p = Abc_NtkToDar(pNtk,0,1);
            pAig = Gia_ManFromAigSimple(p);
            uVar3 = pAbc->pCex->iPo;
            iVar5 = Gia_ManFindFailedPoCex(pAig,pAbc->pCex,0);
            pAbc->pCex->iPo = iVar5;
            Gia_ManStop(pAig);
            uVar4 = pAbc->pCex->iPo;
            if (uVar4 != 0xffffffff) {
              if (uVar3 != uVar4) {
                Abc_Print(0,"Main AIG: The cex refined PO %d instead of PO %d.\n",(ulong)uVar4,
                          (ulong)uVar3);
              }
              p_00 = Saig_ManCexMinPerform(p,pAbc->pCex);
              Aig_ManStop(p);
              Abc_CexFree(p_00);
              return 0;
            }
            pAbc->pCex->iPo = uVar3;
            pcVar6 = "Main AIG: The cex does not fail any outputs.\n";
            iVar5 = -1;
            goto LAB_00233bc2;
          }
          pcVar6 = "Main AIG: The current network is not an AIG.\n";
        }
      }
      iVar5 = 1;
LAB_00233bc2:
      Abc_Print(iVar5,pcVar6);
      return 0;
    }
    if (iVar2 == 0x52) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_00233af0;
      }
      local_40 = atoi(argv[globalUtilOptind]);
      uVar4 = local_40;
      goto joined_r0x002339dc;
    }
  }
  else {
    if (iVar2 == 0x68) goto LAB_00233afc;
    if (iVar2 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_00233973;
    }
  }
  pcVar6 = "Unknown switch.\n";
  iVar5 = -2;
LAB_00233af5:
  Abc_Print(iVar5,pcVar6);
  goto LAB_00233afc;
}

Assistant:

int Abc_CommandCexMin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    Abc_Cex_t * vCexNew = NULL;
    int c;
    int nConfLimit = 1000;
    int nRounds    =    1;
    int fVerbose   =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CRvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRounds < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }

    // check the main AIG
    pNtk = Abc_FrameReadNtk(pAbc);
    if ( pNtk == NULL )
        Abc_Print( 1, "Main AIG: There is no current network.\n");
    else if ( !Abc_NtkIsStrash(pNtk) )
        Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
    else if ( Abc_NtkPiNum(pNtk) != pAbc->pCex->nPis )
        Abc_Print( 1, "Main AIG: The number of PIs (%d) is different from cex (%d).\n", Abc_NtkPiNum(pNtk), pAbc->pCex->nPis );
//      else if ( Abc_NtkLatchNum(pNtk) != pAbc->pCex->nRegs )
//          Abc_Print( 1, "Main AIG: The number of registers (%d) is different from cex (%d).\n", Abc_NtkLatchNum(pNtk), pAbc->pCex->nRegs );
//      else if ( Abc_NtkPoNum(pNtk) <= pAbc->pCex->iPo )
//          Abc_Print( 1, "Main AIG: The number of POs (%d) is less than the PO index in cex (%d).\n", Abc_NtkPoNum(pNtk), pAbc->pCex->iPo );
    else
    {
        Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
        Gia_Man_t * pGia = Gia_ManFromAigSimple( pAig );
//        if ( !Gia_ManVerifyCex( pGia, pAbc->pCex, 0 ) )
        int iPoOld = pAbc->pCex->iPo;
        pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pGia, pAbc->pCex, 0 );
        Gia_ManStop( pGia );
        if ( pAbc->pCex->iPo == -1 )
        {
            pAbc->pCex->iPo = iPoOld;
            Abc_Print( -1, "Main AIG: The cex does not fail any outputs.\n" );
            return 0;
        }
        else if ( iPoOld != pAbc->pCex->iPo )
            Abc_Print( 0, "Main AIG: The cex refined PO %d instead of PO %d.\n", pAbc->pCex->iPo, iPoOld );
        // perform minimization
        vCexNew = Saig_ManCexMinPerform( pAig, pAbc->pCex );
        Aig_ManStop( pAig );
        Abc_CexFree( vCexNew );
//        Abc_FrameReplaceCex( pAbc, &vCexNew );

//        Abc_Print( 1,"Implementation of this command is not finished.\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: cexmin [-CR num] [-vh]\n" );
    Abc_Print( -2, "\t         reduces the length of the counter-example\n" );
    Abc_Print( -2, "\t-C num : the maximum number of conflicts [default = %d]\n", nConfLimit );
    Abc_Print( -2, "\t-R num : the number of minimization rounds [default = %d]\n", nRounds );
    Abc_Print( -2, "\t-v     : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}